

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScanlineAdapterTests.cpp
# Opt level: O1

void __thiscall agge::tests::ScanlineAdapterTests::ScanlineAdapterTests(ScanlineAdapterTests *this)

{
  registry *prVar1;
  
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::ScanlineAdapterTests>
            (prVar1,(offset_in_ScanlineAdapterTests_to_subr)
                    ScanlineAllocatesTheNecessaryAmountOfCoversOnConstruction,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::ScanlineAdapterTests>
            (prVar1,(offset_in_ScanlineAdapterTests_to_subr)CoversArrayIsOnlyBeEnlarged,(char *)0x0)
  ;
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::ScanlineAdapterTests>
            (prVar1,(offset_in_ScanlineAdapterTests_to_subr)
                    CommitingEmptyScanlineLeadsToAnEmptyRenderCall,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::ScanlineAdapterTests>
            (prVar1,(offset_in_ScanlineAdapterTests_to_subr)ScanlineIsPositionedAtZeroOnCreation,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::ScanlineAdapterTests>
            (prVar1,(offset_in_ScanlineAdapterTests_to_subr)AddingCellToCleanScanlineMakesNoCommit,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::ScanlineAdapterTests>
            (prVar1,(offset_in_ScanlineAdapterTests_to_subr)AddingSpanToCleanScanlineMakesNoCommit,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::ScanlineAdapterTests>
            (prVar1,(offset_in_ScanlineAdapterTests_to_subr)AddingAdjacentCellsAndSpansMakesNoCommit
             ,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::ScanlineAdapterTests>
            (prVar1,(offset_in_ScanlineAdapterTests_to_subr)AddingNonAdjacentCellCommitsState,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::ScanlineAdapterTests>
            (prVar1,(offset_in_ScanlineAdapterTests_to_subr)AddCommitCycleMakesRenditionCalls,
             (char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::ScanlineAdapterTests>
            (prVar1,(offset_in_ScanlineAdapterTests_to_subr)
                    StaleCoverValuesAreAccessibleAndUnchanged,(char *)0x0);
  prVar1 = ut::registry_instance();
  ut::registry::add_test<agge::tests::ScanlineAdapterTests>
            (prVar1,(offset_in_ScanlineAdapterTests_to_subr)BeginScanlineDelegatesToSetY,(char *)0x0
            );
  return;
}

Assistant:

test( ScanlineAllocatesTheNecessaryAmountOfCoversOnConstruction )
			{
				// INIT
				mocks::renderer_adapter<> r1;
				raw_memory_object b1;

				mocks::renderer_adapter<uint16_t> r2;
				raw_memory_object b2;

				// INIT / ACT
				scanline_adapter< mocks::renderer_adapter<> > sl1(r1, b1, 11);
				scanline_adapter< mocks::renderer_adapter<uint16_t> > sl2(r2, b2, 17);

				// ASSERT
				assert_is_true(enough_capacity<uint8_t>(b1, 11 + 4));
				assert_is_true(enough_capacity<uint16_t>(b2, 17 + 4));

				// INIT / ACT
				scanline_adapter< mocks::renderer_adapter<> > sl3(r1, b1, 1311);

				// ASSERT
				assert_is_true(enough_capacity<uint8_t>(b1, 1311 + 4));
			}